

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void readsf_dsp(t_readsf *x,t_signal **sp)

{
  int iVar1;
  int local_1c;
  int noutlets;
  int i;
  t_signal **sp_local;
  t_readsf *x_local;
  
  iVar1 = x->x_noutlets;
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  x->x_vecsize = (*sp)->s_n;
  x->x_sigperiod = x->x_fifosize / ((x->x_sf).sf_bytesperframe * x->x_vecsize);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    x->x_outvec[local_1c] = sp[local_1c]->s_vec;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&x->x_mutex);
  dsp_add(readsf_perform,1,x);
  return;
}

Assistant:

static void readsf_dsp(t_readsf *x, t_signal **sp)
{
    int i, noutlets = x->x_noutlets;
    pthread_mutex_lock(&x->x_mutex);
    x->x_vecsize = sp[0]->s_n;
    x->x_sigperiod = x->x_fifosize / (x->x_sf.sf_bytesperframe * x->x_vecsize);
    for (i = 0; i < noutlets; i++)
        x->x_outvec[i] = sp[i]->s_vec;
    pthread_mutex_unlock(&x->x_mutex);
    dsp_add(readsf_perform, 1, x);
}